

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

IRet * __thiscall
vkt::shaderexecutor::
DerivedFunc<vkt::shaderexecutor::Signature<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_>
::doApply(IRet *__return_storage_ptr__,
         DerivedFunc<vkt::shaderexecutor::Signature<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_>
         *this,EvalContext *ctx,IArgs *args)

{
  undefined8 *puVar1;
  double dVar2;
  undefined8 uVar3;
  double dVar4;
  undefined8 uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  ulong uVar9;
  size_t sVar10;
  Variable<tcu::Vector<float,_4>_> *pVVar11;
  Variable<vkt::shaderexecutor::Void> *pVVar12;
  size_type sVar13;
  SharedPtr<const_vkt::shaderexecutor::Statement> *this_00;
  Statement *this_01;
  Expr<tcu::Vector<float,_4>_> *this_02;
  IVal *pIVar14;
  IVal local_118;
  ulong local_b8;
  size_t ndx;
  EvalContext funCtx;
  IArgs *mutArgs;
  Environment funEnv;
  IArgs *args_local;
  EvalContext *ctx_local;
  DerivedFunc<vkt::shaderexecutor::Signature<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_>
  *this_local;
  IRet *ret;
  
  funEnv.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)args;
  Environment::Environment((Environment *)&mutArgs);
  sVar10 = funEnv.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count;
  tcu::Vector<tcu::Interval,_4>::Vector(__return_storage_ptr__);
  initialize(this);
  pVVar11 = de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>::operator*
                      (&(this->m_var0).
                        super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                      );
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&mutArgs,pVVar11,
             *(IVal **)funEnv.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  pVVar11 = de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>::operator*
                      (&(this->m_var1).
                        super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                      );
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&mutArgs,pVVar11,
             *(IVal **)(funEnv.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count + 8));
  pVVar11 = de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>::operator*
                      (&(this->m_var2).
                        super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                      );
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&mutArgs,pVVar11,
             *(IVal **)(funEnv.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10));
  pVVar12 = de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::
            operator*(&(this->m_var3).
                       super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                     );
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&mutArgs,pVVar12,
             *(IVal **)(funEnv.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x18));
  EvalContext::EvalContext
            ((EvalContext *)&ndx,&ctx->format,ctx->floatPrecision,(Environment *)&mutArgs,
             ctx->callDepth);
  local_b8 = 0;
  while( true ) {
    uVar9 = local_b8;
    sVar13 = std::
             vector<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
             ::size(&this->m_body);
    if (sVar13 <= uVar9) break;
    this_00 = &std::
               vector<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
               ::operator[](&this->m_body,local_b8)->
               super_SharedPtr<const_vkt::shaderexecutor::Statement>;
    this_01 = de::SharedPtr<const_vkt::shaderexecutor::Statement>::operator->(this_00);
    Statement::execute(this_01,(EvalContext *)&ndx);
    local_b8 = local_b8 + 1;
  }
  this_02 = de::SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_4>_>_>::operator->
                      ((SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_4>_>_> *)
                       &this->m_ret);
  Expr<tcu::Vector<float,_4>_>::evaluate(&local_118,this_02,(EvalContext *)&ndx);
  __return_storage_ptr__->m_data[3].m_lo = local_118.m_data[3].m_lo;
  __return_storage_ptr__->m_data[3].m_hi = local_118.m_data[3].m_hi;
  __return_storage_ptr__->m_data[2].m_hi = local_118.m_data[2].m_hi;
  __return_storage_ptr__->m_data[3].m_hasNaN = local_118.m_data[3].m_hasNaN;
  *(undefined7 *)&__return_storage_ptr__->m_data[3].field_0x1 = local_118.m_data[3]._1_7_;
  __return_storage_ptr__->m_data[2].m_hasNaN = local_118.m_data[2].m_hasNaN;
  *(undefined7 *)&__return_storage_ptr__->m_data[2].field_0x1 = local_118.m_data[2]._1_7_;
  __return_storage_ptr__->m_data[2].m_lo = local_118.m_data[2].m_lo;
  __return_storage_ptr__->m_data[1].m_lo = local_118.m_data[1].m_lo;
  __return_storage_ptr__->m_data[1].m_hi = local_118.m_data[1].m_hi;
  __return_storage_ptr__->m_data[0].m_hi = local_118.m_data[0].m_hi;
  __return_storage_ptr__->m_data[1].m_hasNaN = local_118.m_data[1].m_hasNaN;
  *(undefined7 *)&__return_storage_ptr__->m_data[1].field_0x1 = local_118.m_data[1]._1_7_;
  __return_storage_ptr__->m_data[0].m_hasNaN = local_118.m_data[0].m_hasNaN;
  *(undefined7 *)&__return_storage_ptr__->m_data[0].field_0x1 = local_118.m_data[0]._1_7_;
  __return_storage_ptr__->m_data[0].m_lo = local_118.m_data[0].m_lo;
  pVVar11 = de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>::operator*
                      (&(this->m_var0).
                        super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                      );
  pIVar14 = Environment::lookup<tcu::Vector<float,4>>((Environment *)&mutArgs,pVVar11);
  puVar1 = *(undefined8 **)sVar10;
  dVar2 = pIVar14->m_data[3].m_hi;
  puVar1[10] = pIVar14->m_data[3].m_lo;
  puVar1[0xb] = dVar2;
  uVar3 = *(undefined8 *)(pIVar14->m_data + 3);
  puVar1[8] = pIVar14->m_data[2].m_hi;
  puVar1[9] = uVar3;
  uVar3 = *(undefined8 *)pIVar14->m_data;
  dVar2 = pIVar14->m_data[0].m_lo;
  dVar4 = pIVar14->m_data[0].m_hi;
  uVar5 = *(undefined8 *)(pIVar14->m_data + 1);
  dVar6 = pIVar14->m_data[1].m_lo;
  dVar7 = pIVar14->m_data[1].m_hi;
  dVar8 = pIVar14->m_data[2].m_lo;
  puVar1[6] = *(undefined8 *)(pIVar14->m_data + 2);
  puVar1[7] = dVar8;
  puVar1[4] = dVar6;
  puVar1[5] = dVar7;
  puVar1[2] = dVar4;
  puVar1[3] = uVar5;
  *puVar1 = uVar3;
  puVar1[1] = dVar2;
  pVVar11 = de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>::operator*
                      (&(this->m_var1).
                        super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                      );
  pIVar14 = Environment::lookup<tcu::Vector<float,4>>((Environment *)&mutArgs,pVVar11);
  puVar1 = *(undefined8 **)(sVar10 + 8);
  dVar2 = pIVar14->m_data[3].m_hi;
  puVar1[10] = pIVar14->m_data[3].m_lo;
  puVar1[0xb] = dVar2;
  uVar3 = *(undefined8 *)(pIVar14->m_data + 3);
  puVar1[8] = pIVar14->m_data[2].m_hi;
  puVar1[9] = uVar3;
  uVar3 = *(undefined8 *)pIVar14->m_data;
  dVar2 = pIVar14->m_data[0].m_lo;
  dVar4 = pIVar14->m_data[0].m_hi;
  uVar5 = *(undefined8 *)(pIVar14->m_data + 1);
  dVar6 = pIVar14->m_data[1].m_lo;
  dVar7 = pIVar14->m_data[1].m_hi;
  dVar8 = pIVar14->m_data[2].m_lo;
  puVar1[6] = *(undefined8 *)(pIVar14->m_data + 2);
  puVar1[7] = dVar8;
  puVar1[4] = dVar6;
  puVar1[5] = dVar7;
  puVar1[2] = dVar4;
  puVar1[3] = uVar5;
  *puVar1 = uVar3;
  puVar1[1] = dVar2;
  pVVar11 = de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>::operator*
                      (&(this->m_var2).
                        super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                      );
  pIVar14 = Environment::lookup<tcu::Vector<float,4>>((Environment *)&mutArgs,pVVar11);
  puVar1 = *(undefined8 **)(sVar10 + 0x10);
  dVar2 = pIVar14->m_data[3].m_hi;
  puVar1[10] = pIVar14->m_data[3].m_lo;
  puVar1[0xb] = dVar2;
  uVar3 = *(undefined8 *)(pIVar14->m_data + 3);
  puVar1[8] = pIVar14->m_data[2].m_hi;
  puVar1[9] = uVar3;
  uVar3 = *(undefined8 *)pIVar14->m_data;
  dVar2 = pIVar14->m_data[0].m_lo;
  dVar4 = pIVar14->m_data[0].m_hi;
  uVar5 = *(undefined8 *)(pIVar14->m_data + 1);
  dVar6 = pIVar14->m_data[1].m_lo;
  dVar7 = pIVar14->m_data[1].m_hi;
  dVar8 = pIVar14->m_data[2].m_lo;
  puVar1[6] = *(undefined8 *)(pIVar14->m_data + 2);
  puVar1[7] = dVar8;
  puVar1[4] = dVar6;
  puVar1[5] = dVar7;
  puVar1[2] = dVar4;
  puVar1[3] = uVar5;
  *puVar1 = uVar3;
  puVar1[1] = dVar2;
  pVVar12 = de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::
            operator*(&(this->m_var3).
                       super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                     );
  Environment::lookup<vkt::shaderexecutor::Void>((Environment *)&mutArgs,pVVar12);
  Environment::~Environment((Environment *)&mutArgs);
  return __return_storage_ptr__;
}

Assistant:

IRet						doApply			(const EvalContext&	ctx,
												 const IArgs&		args) const
	{
		Environment	funEnv;
		IArgs&		mutArgs		= const_cast<IArgs&>(args);
		IRet		ret;

		initialize();

		funEnv.bind(*m_var0, args.a);
		funEnv.bind(*m_var1, args.b);
		funEnv.bind(*m_var2, args.c);
		funEnv.bind(*m_var3, args.d);

		{
			EvalContext	funCtx(ctx.format, ctx.floatPrecision, funEnv, ctx.callDepth);

			for (size_t ndx = 0; ndx < m_body.size(); ++ndx)
				m_body[ndx]->execute(funCtx);

			ret = m_ret->evaluate(funCtx);
		}

		// \todo [lauri] Store references instead of values in environment
		const_cast<IArg0&>(mutArgs.a) = funEnv.lookup(*m_var0);
		const_cast<IArg1&>(mutArgs.b) = funEnv.lookup(*m_var1);
		const_cast<IArg2&>(mutArgs.c) = funEnv.lookup(*m_var2);
		const_cast<IArg3&>(mutArgs.d) = funEnv.lookup(*m_var3);

		return ret;
	}